

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (HeapBlockMap32 *this,void *dirtyPage,HeapBlockType blockType,L2MapChunk *chunk,uint id2,
          bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  ulong uVar1;
  byte bVar2;
  undefined4 *puVar3;
  code *pcVar4;
  long lVar5;
  bool bVar6;
  BVStatic<2048UL> *heapBlockMarkBits;
  ulong uVar7;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block;
  undefined8 *in_FS_OFFSET;
  
  if (chunk == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2c8,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar6) goto LAB_0021766d;
    *puVar3 = 0;
  }
  heapBlockMarkBits =
       BVStatic<65536ul>::GetRange<2048ul>
                 ((BVStatic<65536ul> *)chunk,(uint)((ulong)dirtyPage >> 4) & 0xf800);
  if (heapBlockMarkBits->data[0].word == 0) {
    uVar7 = 0xffffffffffffffff;
    do {
      if (uVar7 == 0x1e) {
        return false;
      }
      uVar1 = uVar7 + 1;
      lVar5 = uVar7 + 2;
      uVar7 = uVar1;
    } while (heapBlockMarkBits->data[lVar5].word == 0);
    if (0x1e < uVar1) {
      return false;
    }
  }
  block = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)chunk->map[id2];
  if ((block->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.heapBlockType !=
      blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2d2,"(chunk->map[id2]->GetHeapBlockType() == blockType)",
                       "chunk->map[id2]->GetHeapBlockType() == blockType");
    if (!bVar6) goto LAB_0021766d;
    *puVar3 = 0;
    block = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)chunk->map[id2];
  }
  bVar2 = chunk->blockInfo[id2].bucketIndex;
  if (0x1c < bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x2ef,
                       "(IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity)))"
                       ,
                       "IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity))"
                      );
    if (!bVar6) {
LAB_0021766d:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  bVar6 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
          ::RescanObjectsOnPage
                    (block,(char *)dirtyPage,(char *)((ulong)dirtyPage & 0xffffffffffff8000),
                     heapBlockMarkBits,(uint)bVar2 * 0x100 + 0x400,(uint)bVar2,
                     anyObjectsMarkedOnPage,recycler);
  if (!bVar6) {
    HeapBlock::SetNeedOOMRescan(chunk->map[id2],recycler);
    return false;
  }
  return true;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlock(void * dirtyPage, HeapBlock::HeapBlockType blockType, L2MapChunk* chunk, uint id2, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    Assert(chunk != nullptr);
    char* heapBlockPageAddress = TBlockType::GetBlockStartAddress((char*) dirtyPage);

    typedef typename TBlockType::HeapBlockAttributes TBlockAttributes;

    // We need to check the entire mark bit vector here. It's not sufficient to just check the page's
    // mark bit vector because the object that's dirty on the page could have started on an earlier page
    auto markBits = chunk->GetMarkBitVectorForPages<TBlockAttributes::BitVectorCount>(heapBlockPageAddress);
    if (!markBits->IsAllClear())
    {
        Assert(chunk->map[id2]->GetHeapBlockType() == blockType);

        // Small finalizable heap blocks require the HeapBlock * (to look up object attributes).
        // For others, this is null
        TBlockType* block = GetHeapBlockForRescan<TBlockType>(chunk, id2);
        uint bucketIndex = chunk->blockInfo[id2].bucketIndex;
        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(block,
            (char *)dirtyPage, heapBlockPageAddress, markBits, HeapInfo::GetObjectSizeForBucketIndex<TBlockAttributes>(bucketIndex), bucketIndex, anyObjectsMarkedOnPage, recycler))
        {
            // Failed due to OOM
            ((TBlockType*) chunk->map[id2])->SetNeedOOMRescan(recycler);
            return false;
        }

        return true;
    }

    // Didn't actually rescan the block.
    return false;
}